

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  long lVar1;
  char *value;
  FileDescriptor *pFVar2;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  FileOptions *pFVar3;
  FileOptions *pFVar4;
  int i;
  int index;
  long lVar5;
  int i_1;
  long lVar6;
  
  FileDescriptorProto::set_name(proto,*(string **)this);
  if ((*(string **)(this + 8))->_M_string_length != 0) {
    FileDescriptorProto::set_package(proto,*(string **)(this + 8));
  }
  if (*(int *)(this + 0x8c) == 3) {
    value = SyntaxName(SYNTAX_PROTO3);
    FileDescriptorProto::set_syntax(proto,value);
  }
  for (index = 0; index < *(int *)(this + 0x18); index = index + 1) {
    pFVar2 = dependency(this,index);
    FileDescriptorProto::add_dependency(proto,*(string **)pFVar2);
  }
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x38); lVar6 = lVar6 + 1) {
    FileDescriptorProto::add_public_dependency(proto,*(int32 *)(*(long *)(this + 0x40) + lVar6 * 4))
    ;
  }
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x48); lVar6 = lVar6 + 1) {
    FileDescriptorProto::add_weak_dependency(proto,*(int32 *)(*(long *)(this + 0x50) + lVar6 * 4));
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x58); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(this + 0x60);
    proto_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&proto->message_type_);
    Descriptor::CopyTo((Descriptor *)(lVar1 + lVar5),proto_00);
    lVar5 = lVar5 + 0xa8;
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x68); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(this + 0x70);
    proto_01 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&proto->enum_type_);
    EnumDescriptor::CopyTo((EnumDescriptor *)(lVar1 + lVar5),proto_01);
    lVar5 = lVar5 + 0x38;
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x78); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(this + 0x80);
    proto_02 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Add(&proto->service_);
    ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar1 + lVar5),proto_02);
    lVar5 = lVar5 + 0x30;
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x88); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(this + 0x98);
    proto_03 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->extension_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar1 + lVar5),proto_03);
    lVar5 = lVar5 + 0xa8;
  }
  pFVar4 = *(FileOptions **)(this + 0xa0);
  pFVar3 = FileOptions::default_instance();
  if (pFVar4 != pFVar3) {
    pFVar4 = FileDescriptorProto::mutable_options(proto);
    FileOptions::CopyFrom(pFVar4,*(FileOptions **)(this + 0xa0));
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}